

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAnnotationObjectHelper.cc
# Opt level: O1

string * __thiscall
QPDFAnnotationObjectHelper::getPageContentForAppearance
          (string *__return_storage_ptr__,QPDFAnnotationObjectHelper *this,string *name,int rotate,
          int required_flags,int forbidden_flags)

{
  pointer pcVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  double dVar5;
  Rectangle r;
  bool bVar6;
  uint uVar7;
  long *plVar8;
  element_type *peVar9;
  size_type *psVar10;
  byte bVar11;
  double dVar12;
  QPDFMatrix matrix;
  QPDFMatrix AA;
  QPDFObjectHandle as;
  Rectangle T;
  QPDFObjectHandle matrix_obj;
  QPDFObjectHandle bbox_obj;
  QPDFObjectHandle rect_obj;
  Rectangle bbox;
  undefined1 local_1f8 [32];
  double local_1d8;
  double dStack_1d0;
  undefined1 local_1c0 [32];
  double local_1a0;
  double dStack_198;
  QPDFAnnotationObjectHelper local_190;
  string local_158;
  string local_138;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [32];
  double local_d8;
  element_type *local_d0;
  QPDFObjectHandle local_c8;
  QPDFObjectHandle local_b8;
  QPDFObjectHandle local_a8;
  string *local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Rectangle local_50;
  
  pcVar1 = local_1f8 + 0x10;
  local_1f8._0_8_ = pcVar1;
  local_190.m.super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = required_flags;
  local_190.m.super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = forbidden_flags;
  local_98 = name;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"/N","");
  pcVar2 = local_1c0 + 0x10;
  local_1c0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"");
  getAppearanceStream(&local_190,(string *)this,(string *)local_1f8);
  bVar6 = QPDFObjectHandle::isStream((QPDFObjectHandle *)&local_190);
  if (local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if ((pointer)local_1c0._0_8_ != pcVar2) {
    operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
  }
  if ((pointer)local_1f8._0_8_ != pcVar1) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  if (bVar6) {
    local_1c0._0_8_ =
         (this->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_1c0._8_8_ =
         (this->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_)->_M_use_count + 1;
      }
    }
    local_1f8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"/Rect","");
    QPDFObjectHandle::getKey(&local_a8,(string *)local_1c0);
    if ((pointer)local_1f8._0_8_ != pcVar1) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
    }
    local_1f8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"/N","");
    local_1c0._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"");
    getAppearanceStream(&local_190,(string *)this,(string *)local_1f8);
    QPDFObjectHandle::getDict((QPDFObjectHandle *)local_f8);
    if (local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if ((pointer)local_1c0._0_8_ != pcVar2) {
      operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
    }
    if ((pointer)local_1f8._0_8_ != pcVar1) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    local_1f8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"/BBox","");
    QPDFObjectHandle::getKey(&local_b8,(string *)local_f8);
    if ((pointer)local_1f8._0_8_ != pcVar1) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    local_1f8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"/Matrix","");
    QPDFObjectHandle::getKey(&local_c8,(string *)local_f8);
    if ((pointer)local_1f8._0_8_ != pcVar1) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    uVar7 = getFlags(this);
    if ((local_190.m.
         super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._4_4_ & uVar7) == 0) {
      if (((uint)local_190.m.
                 super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi & ~uVar7) == 0) {
        bVar6 = QPDFObjectHandle::isRectangle(&local_b8);
        if ((bVar6) && (bVar6 = QPDFObjectHandle::isRectangle(&local_a8), bVar6)) {
          QPDFMatrix::QPDFMatrix((QPDFMatrix *)local_1f8);
          bVar6 = QPDFObjectHandle::isMatrix(&local_c8);
          if (bVar6) {
            QPDFObjectHandle::getArrayAsMatrix((Matrix *)&local_190,&local_c8);
            QPDFMatrix::QPDFMatrix((QPDFMatrix *)local_1c0,(Matrix *)&local_190);
            local_1d8 = local_1a0;
            dStack_1d0 = dStack_198;
            local_1f8._16_8_ = local_1c0._16_8_;
            local_1f8._24_8_ = local_1c0._24_8_;
            local_1f8._0_8_ = local_1c0._0_8_;
            local_1f8._8_8_ = local_1c0._8_8_;
          }
          QPDFObjectHandle::getArrayAsRectangle((Rectangle *)&local_190,&local_a8);
          bVar11 = (byte)((uVar7 & 0x10) >> 4) & rotate != 0;
          if (bVar11 == 1) {
            QPDFMatrix::QPDFMatrix((QPDFMatrix *)local_1c0);
            QPDFMatrix::rotatex90((QPDFMatrix *)local_1c0,rotate);
            QPDFMatrix::concat((QPDFMatrix *)local_1c0,(QPDFMatrix *)local_1f8);
            local_1d8 = local_1a0;
            dStack_1d0 = dStack_198;
            local_1f8._16_8_ = local_1c0._16_8_;
            local_1f8._24_8_ = local_1c0._24_8_;
            local_1f8._0_8_ = local_1c0._0_8_;
            local_1f8._8_8_ = local_1c0._8_8_;
            dVar5 = (double)local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi - (double)local_190.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
            dVar12 = (double)local_190.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
                     (double)local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (rotate == 0x5a) {
              local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((double)local_190.super_QPDFObjectHelper._vptr_QPDFObjectHelper + dVar12);
              local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   local_190.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_190.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   (dVar5 + (double)local_190.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr);
            }
            else if (rotate == 0xb4) {
              local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   local_190.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_190.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
              local_190.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                   (_func_int **)
                   ((double)local_190.super_QPDFObjectHelper._vptr_QPDFObjectHelper - dVar5);
              local_190.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   (dVar12 + (double)local_190.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr);
            }
            else if (rotate == 0x10e) {
              local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   ((double)local_190.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
                   dVar5);
              local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_190.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
              local_190.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
                   (_func_int **)
                   ((double)local_190.super_QPDFObjectHelper._vptr_QPDFObjectHelper - dVar12);
            }
          }
          QPDFObjectHandle::getArrayAsRectangle(&local_50,&local_b8);
          r.lly = local_50.lly;
          r.llx = local_50.llx;
          r.urx = local_50.urx;
          r.ury = local_50.ury;
          QPDFMatrix::transformRectangle((Rectangle *)(local_f8 + 0x10),(QPDFMatrix *)local_1f8,r);
          if (((local_d8 == (double)local_f8._16_8_) &&
              (!NAN(local_d8) && !NAN((double)local_f8._16_8_))) ||
             (((double)local_d0 == (double)local_f8._24_8_ &&
              (!NAN((double)local_d0) && !NAN((double)local_f8._24_8_))))) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
          }
          else {
            QPDFMatrix::QPDFMatrix((QPDFMatrix *)local_1c0);
            QPDFMatrix::translate
                      ((QPDFMatrix *)local_1c0,
                       (double)local_190.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                       (double)local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
            QPDFMatrix::scale((QPDFMatrix *)local_1c0,
                              ((double)local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
                                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount._M_pi -
                              (double)local_190.super_QPDFObjectHelper._vptr_QPDFObjectHelper) /
                              (local_d8 - (double)local_f8._16_8_),
                              ((double)local_190.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_ptr -
                              (double)local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr) / ((double)local_d0 - (double)local_f8._24_8_));
            QPDFMatrix::translate
                      ((QPDFMatrix *)local_1c0,-(double)local_f8._16_8_,-(double)local_f8._24_8_);
            if (bVar11 != 0) {
              QPDFMatrix::rotatex90((QPDFMatrix *)local_1c0,rotate);
            }
            paVar3 = &local_158.field_2;
            local_158._M_dataplus._M_p = (pointer)paVar3;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/Subtype","");
            paVar4 = &local_138.field_2;
            local_138._M_dataplus._M_p = (pointer)paVar4;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"/Form","");
            QPDFObjectHandle::newName((QPDFObjectHandle *)local_118,&local_138);
            QPDFObjectHandle::replaceKey
                      ((QPDFObjectHandle *)local_f8,&local_158,(QPDFObjectHandle *)local_118);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != paVar4) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != paVar3) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            QPDFMatrix::unparse_abi_cxx11_(&local_90,(QPDFMatrix *)local_1c0);
            std::operator+(&local_70,"q\n",&local_90);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
            peVar9 = (element_type *)(plVar8 + 2);
            if ((element_type *)*plVar8 == peVar9) {
              local_108._0_8_ =
                   *(undefined8 *)
                    &(peVar9->value).
                     super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
              ;
              local_108._8_8_ = plVar8[3];
              local_118._0_8_ = (element_type *)local_108;
            }
            else {
              local_108._0_8_ =
                   *(undefined8 *)
                    &(peVar9->value).
                     super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
              ;
              local_118._0_8_ = (element_type *)*plVar8;
            }
            local_118._8_8_ = plVar8[1];
            *plVar8 = (long)peVar9;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::operator+(&local_138,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_118,local_98);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_138);
            psVar10 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_158.field_2._M_allocated_capacity = *psVar10;
              local_158.field_2._8_8_ = plVar8[3];
              local_158._M_dataplus._M_p = (pointer)paVar3;
            }
            else {
              local_158.field_2._M_allocated_capacity = *psVar10;
              local_158._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_158._M_string_length = plVar8[1];
            *plVar8 = (long)psVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::operator+(__return_storage_ptr__,&local_158,"Q\n");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != paVar3) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != paVar4) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            if ((element_type *)local_118._0_8_ != (element_type *)local_108) {
              operator_delete((void *)local_118._0_8_,local_108._0_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
          }
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
        }
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    if (local_c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
    }
    if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFAnnotationObjectHelper::getPageContentForAppearance(
    std::string const& name, int rotate, int required_flags, int forbidden_flags)
{
    if (!getAppearanceStream("/N").isStream()) {
        return "";
    }

    // The appearance matrix computed by this method is the transformation matrix that needs to be
    // in effect when drawing this annotation's appearance stream on the page. The algorithm for
    // computing the appearance matrix described in section 12.5.5 of the ISO-32000 PDF spec is
    // similar but not identical to what we are doing here.

    // When rendering an appearance stream associated with an annotation, there are four relevant
    // components:
    //
    // * The appearance stream's bounding box (/BBox)
    // * The appearance stream's matrix (/Matrix)
    // * The annotation's rectangle (/Rect)
    // * In the case of form fields with the NoRotate flag, the page's rotation

    // When rendering a form xobject in isolation, just drawn with a /Do operator, there is no form
    // field, so page rotation is not relevant, and there is no annotation, so /Rect is not
    // relevant, so only /BBox and /Matrix are relevant. The effect of these are as follows:

    // * /BBox is treated as a clipping region
    // * /Matrix is applied as a transformation prior to rendering the appearance stream.

    // There is no relationship between /BBox and /Matrix in this case.

    // When rendering a form xobject in the context of an annotation, things are a little different.
    // In particular, a matrix is established such that /BBox, when transformed by /Matrix, would
    // fit completely inside of /Rect. /BBox is no longer a clipping region. To illustrate the
    // difference, consider a /Matrix of [2 0 0 2 0 0], which is scaling by a factor of two along
    // both axes. If the appearance stream drew a rectangle equal to /BBox, in the case of the form
    // xobject in isolation, this matrix would cause only the lower-left quadrant of the rectangle
    // to be visible since the scaling would cause the rest of it to fall outside of the clipping
    // region. In the case of the form xobject displayed in the context of an annotation, such a
    // matrix would have no effect at all because it would be applied to the bounding box first, and
    // then when the resulting enclosing quadrilateral was transformed to fit into /Rect, the effect
    // of the scaling would be undone.

    // Our job is to create a transformation matrix that compensates for these differences so that
    // the appearance stream of an annotation can be drawn as a regular form xobject.

    // To do this, we perform the following steps, which overlap significantly with the algorithm
    // in 12.5.5:

    // 1. Transform the four corners of /BBox by applying /Matrix to them, creating an arbitrarily
    //    transformed quadrilateral.

    // 2. Find the minimum upright rectangle that encompasses the resulting quadrilateral. This is
    //    the "transformed appearance box", T.

    // 3. Compute matrix A that maps the lower left and upper right corners of T to the annotation's
    //    /Rect. This can be done by scaling so that the sizes match and translating so that the
    //    scaled T exactly overlaps /Rect.

    // If the annotation's /F flag has bit 4 set, this means that annotation is to be rotated about
    // its upper left corner to counteract any rotation of the page so it remains upright. To
    // achieve this effect, we do the following extra steps:

    // 1. Perform the rotation on /BBox box prior to transforming it with /Matrix (by replacing
    //    matrix with concatenation of matrix onto the rotation)

    // 2. Rotate the destination rectangle by the specified amount

    // 3. Apply the rotation to A as computed above to get the final appearance matrix.

    QPDFObjectHandle rect_obj = oh().getKey("/Rect");
    QPDFObjectHandle as = getAppearanceStream("/N").getDict();
    QPDFObjectHandle bbox_obj = as.getKey("/BBox");
    QPDFObjectHandle matrix_obj = as.getKey("/Matrix");

    int flags = getFlags();
    if (flags & forbidden_flags) {
        QTC::TC("qpdf", "QPDFAnnotationObjectHelper forbidden flags");
        return "";
    }
    if ((flags & required_flags) != required_flags) {
        QTC::TC("qpdf", "QPDFAnnotationObjectHelper missing required flags");
        return "";
    }

    if (!(bbox_obj.isRectangle() && rect_obj.isRectangle())) {
        return "";
    }
    QPDFMatrix matrix;
    if (matrix_obj.isMatrix()) {
        QTC::TC("qpdf", "QPDFAnnotationObjectHelper explicit matrix");
        matrix = QPDFMatrix(matrix_obj.getArrayAsMatrix());
    } else {
        QTC::TC("qpdf", "QPDFAnnotationObjectHelper default matrix");
    }
    QPDFObjectHandle::Rectangle rect = rect_obj.getArrayAsRectangle();
    bool do_rotate = (rotate && (flags & an_no_rotate));
    if (do_rotate) {
        // If the annotation flags include the NoRotate bit and the page is rotated, we have to
        // rotate the annotation about its upper left corner by the same amount in the opposite
        // direction so that it will remain upright in absolute coordinates. Since the semantics of
        // /Rotate for a page are to rotate the page, while the effect of rotating using a
        // transformation matrix is to rotate the coordinate system, the opposite directionality is
        // explicit in the code.
        QPDFMatrix mr;
        mr.rotatex90(rotate);
        mr.concat(matrix);
        matrix = mr;
        double rect_w = rect.urx - rect.llx;
        double rect_h = rect.ury - rect.lly;
        switch (rotate) {
        case 90:
            QTC::TC("qpdf", "QPDFAnnotationObjectHelper rotate 90");
            rect = QPDFObjectHandle::Rectangle(
                rect.llx, rect.ury, rect.llx + rect_h, rect.ury + rect_w);
            break;
        case 180:
            QTC::TC("qpdf", "QPDFAnnotationObjectHelper rotate 180");
            rect = QPDFObjectHandle::Rectangle(
                rect.llx - rect_w, rect.ury, rect.llx, rect.ury + rect_h);
            break;
        case 270:
            QTC::TC("qpdf", "QPDFAnnotationObjectHelper rotate 270");
            rect = QPDFObjectHandle::Rectangle(
                rect.llx - rect_h, rect.ury - rect_w, rect.llx, rect.ury);
            break;
        default:
            // ignore
            break;
        }
    }

    // Transform bounding box by matrix to get T
    QPDFObjectHandle::Rectangle bbox = bbox_obj.getArrayAsRectangle();
    QPDFObjectHandle::Rectangle T = matrix.transformRectangle(bbox);
    if ((T.urx == T.llx) || (T.ury == T.lly)) {
        // avoid division by zero
        return "";
    }
    // Compute a matrix to transform the appearance box to the rectangle
    QPDFMatrix AA;
    AA.translate(rect.llx, rect.lly);
    AA.scale((rect.urx - rect.llx) / (T.urx - T.llx), (rect.ury - rect.lly) / (T.ury - T.lly));
    AA.translate(-T.llx, -T.lly);
    if (do_rotate) {
        AA.rotatex90(rotate);
    }

    as.replaceKey("/Subtype", QPDFObjectHandle::newName("/Form"));
    return ("q\n" + AA.unparse() + " cm\n" + name + " Do\n" + "Q\n");
}